

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O2

ssize_t program_filter_read(archive_read_filter *self,void **buff)

{
  void *pvVar1;
  program_filter *state;
  int iVar2;
  ssize_t sVar3;
  void *__buf;
  int *piVar4;
  ulong uVar5;
  void *__buf_00;
  size_t __nbytes;
  size_t local_40;
  void **local_38;
  
  pvVar1 = self->data;
  __buf_00 = *(void **)((long)pvVar1 + 0x30);
  uVar5 = 0;
  local_38 = buff;
  do {
    if ((*(int *)((long)pvVar1 + 0x28) == -1) ||
       (__nbytes = *(ulong *)((long)pvVar1 + 0x38) - uVar5,
       *(ulong *)((long)pvVar1 + 0x38) < uVar5 || __nbytes == 0)) {
LAB_001edaac:
      *local_38 = *(void **)((long)pvVar1 + 0x30);
      return uVar5;
    }
    state = (program_filter *)self->data;
    if (0x7ffffffffffffffe < __nbytes) {
      __nbytes = 0x7fffffffffffffff;
    }
LAB_001ed946:
    sVar3 = read(state->child_stdout,__buf_00,__nbytes);
    if (sVar3 == -1) break;
    if (sVar3 < 1) {
      if (sVar3 != 0) goto LAB_001ed97f;
      goto LAB_001eda93;
    }
    uVar5 = uVar5 + sVar3;
    __buf_00 = (void *)((long)__buf_00 + sVar3);
  } while( true );
  piVar4 = __errno_location();
  iVar2 = *piVar4;
  if (iVar2 != 4) {
    if (iVar2 == 0xb) {
LAB_001ed97f:
      if (state->child_stdin == -1) {
        __archive_check_child(-1,state->child_stdout);
        goto LAB_001ed946;
      }
      __buf = __archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_40);
      if (__buf == (void *)0x0) {
        close(state->child_stdin);
        state->child_stdin = -1;
        fcntl(state->child_stdout,4,0);
        if (-1 < (long)local_40) goto LAB_001ed946;
      }
      else {
        do {
          sVar3 = write(state->child_stdin,__buf,local_40);
          if (sVar3 != -1) {
            if (sVar3 < 1) {
              close(state->child_stdin);
              state->child_stdin = -1;
              fcntl(state->child_stdout,4,0);
            }
            else {
              __archive_read_filter_consume(self->upstream,sVar3);
            }
            goto LAB_001ed946;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        if (*piVar4 == 0xb) {
          __archive_check_child(state->child_stdin,state->child_stdout);
          goto LAB_001ed946;
        }
        close(state->child_stdin);
        state->child_stdin = -1;
        fcntl(state->child_stdout,4,0);
        if (*piVar4 == 0x20) goto LAB_001ed946;
      }
    }
    else if (iVar2 == 0x20) {
LAB_001eda93:
      iVar2 = child_stop(self,state);
      if (-1 < iVar2) goto LAB_001edaac;
    }
    return -0x1e;
  }
  goto LAB_001ed946;
}

Assistant:

static ssize_t
program_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct program_filter *state;
	ssize_t bytes;
	size_t total;
	char *p;

	state = (struct program_filter *)self->data;

	total = 0;
	p = state->out_buf;
	while (state->child_stdout != -1 && total < state->out_buf_len) {
		bytes = child_read(self, p, state->out_buf_len - total);
		if (bytes < 0)
			/* No recovery is possible if we can no longer
			 * read from the child. */
			return (ARCHIVE_FATAL);
		if (bytes == 0)
			/* We got EOF from the child. */
			break;
		total += bytes;
		p += bytes;
	}

	*buff = state->out_buf;
	return (total);
}